

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

string * __thiscall
cmLocalGenerator::GetObjectFileNameWithoutTarget
          (string *__return_storage_ptr__,cmLocalGenerator *this,cmSourceFile *source,
          string *dir_max,bool *hasSourceExtension,char *customOutputExtension)

{
  cmMakefile *this_00;
  pointer pcVar1;
  bool bVar2;
  string *psVar3;
  string *psVar4;
  string *psVar5;
  cmValue cVar6;
  cmValue cVar7;
  long lVar8;
  cmStateSnapshot *this_01;
  bool *pbVar9;
  bool bVar10;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string objectName;
  string relFromBinary;
  string relFromSource;
  string lang;
  RegularExpression var;
  pointer local_320;
  string local_318;
  bool *local_2f8;
  string local_2f0;
  string *local_2d0;
  string *local_2c8;
  string local_2c0;
  undefined1 local_2a0 [32];
  string local_280;
  undefined1 local_260 [16];
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> local_250;
  char *local_220;
  char *local_60;
  char *local_50;
  char *local_40;
  int local_38;
  
  local_2f8 = hasSourceExtension;
  local_2d0 = dir_max;
  psVar3 = cmSourceFile::GetFullPath_abi_cxx11_(source);
  psVar4 = cmake::GetHomeDirectory_abi_cxx11_(this->GlobalGenerator->CMakeInstance);
  this_01 = &(this->super_cmOutputConverter).StateSnapshot;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_260,this_01);
  psVar5 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_260);
  anon_unknown.dwarf_1c9ec5::relativeIfUnder(&local_2c0,psVar4,psVar5,psVar3);
  if (local_2c0._M_string_length == 0) {
    __assert_fail("!relFromSource.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmLocalGenerator.cxx"
                  ,0xfd8,
                  "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
                 );
  }
  cmsys::SystemTools::FileIsFullPath(&local_2c0);
  local_2c8 = __return_storage_ptr__;
  psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->GlobalGenerator->CMakeInstance);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_260,this_01);
  psVar5 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_260);
  anon_unknown.dwarf_1c9ec5::relativeIfUnder(&local_2f0,psVar4,psVar5,psVar3);
  if (local_2f0._M_string_length == 0) {
    __assert_fail("!relFromBinary.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmLocalGenerator.cxx"
                  ,0xfdf,
                  "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
                 );
  }
  cmsys::SystemTools::FileIsFullPath(&local_2f0);
  local_318._M_string_length = 0;
  local_318.field_2._M_local_buf[0] = '\0';
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_assign((string *)&local_318);
  psVar3 = local_2c8;
  bVar2 = cmsys::SystemTools::FileIsFullPath(&local_318);
  if ((bVar2) && (bVar2 = cmake::GetIsInTryCompile(this->GlobalGenerator->CMakeInstance), bVar2)) {
    psVar4 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    cmsys::SystemTools::GetFilenameName((string *)local_260,psVar4);
    std::__cxx11::string::operator=((string *)&local_318,(string *)local_260);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_260._0_8_ != &local_250)
    {
      operator_delete((void *)local_260._0_8_,
                      (ulong)((long)local_250.Data.
                                    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
  }
  local_260._0_8_ = &local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"UNITY_SOURCE_FILE","");
  cVar6 = cmSourceFile::GetProperty(source,(string *)local_260);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_260._0_8_ != &local_250) {
    operator_delete((void *)local_260._0_8_,
                    (ulong)((long)local_250.Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  local_260._0_8_ = &local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"PCH_EXTENSION","");
  cVar7 = cmSourceFile::GetProperty(source,(string *)local_260);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_260._0_8_ != &local_250) {
    operator_delete((void *)local_260._0_8_,
                    (ulong)((long)local_250.Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  lVar8 = std::__cxx11::string::find((char *)&local_318,0x81c277,0);
  local_320 = customOutputExtension;
  if (((cVar6.Value != (string *)0x0) || (cVar7.Value != (string *)0x0)) || (lVar8 != -1)) {
    if (cVar7.Value != (string *)0x0) {
      local_320 = ((cVar7.Value)->_M_dataplus)._M_p;
    }
    local_50 = (char *)0x0;
    local_40 = (char *)0x0;
    local_38 = 0;
    memset((RegularExpression *)local_260,0,0x20a);
    cmsys::RegularExpression::compile((RegularExpression *)local_260,"(CMakeFiles/[^/]+.dir/)");
    bVar2 = cmsys::RegularExpression::find
                      ((RegularExpression *)local_260,local_318._M_dataplus._M_p,
                       (RegularExpressionMatch *)local_260);
    if (bVar2) {
      std::__cxx11::string::erase((ulong)&local_318,local_260._0_8_ - (long)local_60);
    }
    if (local_40 != (char *)0x0) {
      operator_delete__(local_40);
    }
  }
  local_260._0_8_ = &local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"KEEP_EXTENSION","");
  bVar2 = cmSourceFile::GetPropertyAsBool(source,(string *)local_260);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_260._0_8_ != &local_250) {
    operator_delete((void *)local_260._0_8_,
                    (ulong)((long)local_250.Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  pbVar9 = local_2f8;
  bVar10 = true;
  if (bVar2) goto LAB_001d3ae7;
  bVar2 = NeedBackwardsCompatibility_2_4(this);
  if (bVar2) {
LAB_001d3a0e:
    lVar8 = std::__cxx11::string::rfind((char)&local_318,0x2e);
    if (lVar8 != -1) {
      std::__cxx11::string::substr((ulong)local_260,(ulong)&local_318);
      std::__cxx11::string::operator=((string *)&local_318,(string *)local_260);
      pbVar9 = local_2f8;
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_260._0_8_ !=
          &local_250) {
        operator_delete((void *)local_260._0_8_,
                        (ulong)((long)local_250.Data.
                                      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
        pbVar9 = local_2f8;
      }
    }
    if (local_320 != (pointer)0x0) {
      std::__cxx11::string::append((char *)&local_318);
      bVar10 = false;
      goto LAB_001d3ae7;
    }
    bVar10 = false;
  }
  else {
    cmSourceFile::GetLanguage_abi_cxx11_((string *)local_2a0,source);
    if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_2a0._8_8_ ==
        (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0) {
      bVar2 = false;
    }
    else {
      this_00 = this->Makefile;
      local_260._0_8_ = &DAT_00000006;
      local_260._8_8_ = "CMAKE_";
      local_250.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_250.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2a0._8_8_;
      local_250.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2a0._0_8_;
      local_250.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_250.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)&DAT_00000019;
      local_250.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x7cc351;
      local_220 = (char *)0x0;
      views._M_len = 3;
      views._M_array = (iterator)local_260;
      cmCatViews(&local_280,views);
      bVar2 = cmMakefile::IsOn(this_00,&local_280);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
    }
    if ((pointer)local_2a0._0_8_ != (pointer)(local_2a0 + 0x10)) {
      operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
    }
    bVar10 = true;
    pbVar9 = local_2f8;
    if ((bVar2 | local_320 != (pointer)0x0) == 1) goto LAB_001d3a0e;
  }
  cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
            ((string *)local_260,this->GlobalGenerator,source);
  std::__cxx11::string::_M_append((char *)&local_318,local_260._0_8_);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_260._0_8_ != &local_250) {
    operator_delete((void *)local_260._0_8_,
                    (ulong)((long)local_250.Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
LAB_001d3ae7:
  if (pbVar9 != (bool *)0x0) {
    *pbVar9 = bVar10;
  }
  psVar4 = CreateSafeUniqueObjectFileName(this,&local_318,local_2d0);
  (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar3,pcVar1,pcVar1 + psVar4->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,
                    CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                             local_318.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  return psVar3;
}

Assistant:

std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(
  const cmSourceFile& source, std::string const& dir_max,
  bool* hasSourceExtension, char const* customOutputExtension)
{
  // Construct the object file name using the full path to the source
  // file which is its only unique identification.
  std::string const& fullPath = source.GetFullPath();

  // Try referencing the source relative to the source tree.
  std::string relFromSource = relativeIfUnder(
    this->GetSourceDirectory(), this->GetCurrentSourceDirectory(), fullPath);
  assert(!relFromSource.empty());
  bool relSource = !cmSystemTools::FileIsFullPath(relFromSource);
  bool subSource = relSource && relFromSource[0] != '.';

  // Try referencing the source relative to the binary tree.
  std::string relFromBinary = relativeIfUnder(
    this->GetBinaryDirectory(), this->GetCurrentBinaryDirectory(), fullPath);
  assert(!relFromBinary.empty());
  bool relBinary = !cmSystemTools::FileIsFullPath(relFromBinary);
  bool subBinary = relBinary && relFromBinary[0] != '.';

  // Select a nice-looking reference to the source file to construct
  // the object file name.
  std::string objectName;
  // XXX(clang-tidy): https://bugs.llvm.org/show_bug.cgi?id=44165
  // NOLINTNEXTLINE(bugprone-branch-clone)
  if ((relSource && !relBinary) || (subSource && !subBinary)) {
    objectName = relFromSource;
  } else if ((relBinary && !relSource) || (subBinary && !subSource) ||
             relFromBinary.length() < relFromSource.length()) {
    objectName = relFromBinary;
  } else {
    objectName = relFromSource;
  }

  // if it is still a full path check for the try compile case
  // try compile never have in source sources, and should not
  // have conflicting source file names in the same target
  if (cmSystemTools::FileIsFullPath(objectName)) {
    if (this->GetGlobalGenerator()->GetCMakeInstance()->GetIsInTryCompile()) {
      objectName = cmSystemTools::GetFilenameName(source.GetFullPath());
    }
  }

  // Ensure that for the CMakeFiles/<target>.dir/generated_source_file
  // we don't end up having:
  // CMakeFiles/<target>.dir/CMakeFiles/<target>.dir/generated_source_file.obj
  cmValue unitySourceFile = source.GetProperty("UNITY_SOURCE_FILE");
  cmValue pchExtension = source.GetProperty("PCH_EXTENSION");
  const bool isPchObject = objectName.find("cmake_pch") != std::string::npos;
  if (unitySourceFile || pchExtension || isPchObject) {
    if (pchExtension) {
      customOutputExtension = pchExtension->c_str();
    }

    cmsys::RegularExpression var("(CMakeFiles/[^/]+.dir/)");
    if (var.find(objectName)) {
      objectName.erase(var.start(), var.end() - var.start());
    }
  }

  // Replace the original source file extension with the object file
  // extension.
  bool keptSourceExtension = true;
  if (!source.GetPropertyAsBool("KEEP_EXTENSION")) {
    // Decide whether this language wants to replace the source
    // extension with the object extension.  For CMake 2.4
    // compatibility do this by default.
    bool replaceExt = this->NeedBackwardsCompatibility_2_4();
    if (!replaceExt) {
      std::string lang = source.GetLanguage();
      if (!lang.empty()) {
        replaceExt = this->Makefile->IsOn(
          cmStrCat("CMAKE_", lang, "_OUTPUT_EXTENSION_REPLACE"));
      }
    }

    // Remove the source extension if it is to be replaced.
    if (replaceExt || customOutputExtension) {
      keptSourceExtension = false;
      std::string::size_type dot_pos = objectName.rfind('.');
      if (dot_pos != std::string::npos) {
        objectName = objectName.substr(0, dot_pos);
      }
    }

    // Store the new extension.
    if (customOutputExtension) {
      objectName += customOutputExtension;
    } else {
      objectName += this->GlobalGenerator->GetLanguageOutputExtension(source);
    }
  }
  if (hasSourceExtension) {
    *hasSourceExtension = keptSourceExtension;
  }

  // Convert to a safe name.
  return this->CreateSafeUniqueObjectFileName(objectName, dir_max);
}